

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall
sf::Image::copy(Image *this,Image *source,uint destX,uint destY,IntRect *sourceRect,bool applyAlpha)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Image *pIVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint i_1;
  int k_1;
  int k;
  Uint8 out_alpha;
  Uint8 dst_alpha;
  Uint8 src_alpha;
  Uint8 *dst;
  Uint8 *src;
  uint j;
  uint i;
  Uint8 *dstPixels;
  Uint8 *srcPixels;
  int dstStride;
  int srcStride;
  uint rows;
  size_t pitch;
  uint height;
  uint width;
  IntRect srcRect;
  uint local_90;
  int local_8c;
  int local_88;
  uint local_70;
  uint local_6c;
  reference local_68;
  const_reference local_60;
  uint local_3c;
  uint local_38;
  undefined8 local_34;
  Vector2u local_2c;
  
  pIVar4 = source;
  if (((((source->m_size).x == 0) || ((source->m_size).y == 0)) ||
      (pIVar4 = this, (this->m_size).x == 0)) || ((this->m_size).y == 0)) {
    local_90 = (uint)pIVar4;
  }
  else {
    local_34._0_4_ = sourceRect->left;
    local_34._4_4_ = sourceRect->top;
    local_2c.x = sourceRect->width;
    local_2c.y = sourceRect->height;
    if ((local_2c.x == 0) || (local_2c.y == 0)) {
      local_34 = 0;
      local_2c = source->m_size;
    }
    else {
      if ((int)local_34 < 0) {
        local_34 = local_34 & 0xffffffff00000000;
      }
      if ((long)local_34 < 0) {
        local_34 = local_34 & 0xffffffff;
      }
      if ((int)(source->m_size).x < (int)local_2c.x) {
        local_2c.x = (source->m_size).x;
      }
      if ((int)(source->m_size).y < (int)local_2c.y) {
        local_2c.y = (source->m_size).y;
      }
    }
    local_38 = local_2c.x;
    local_3c = local_2c.y;
    if ((this->m_size).x < destX + local_2c.x) {
      local_38 = (this->m_size).x - destX;
    }
    local_90 = destY + local_2c.y;
    if ((this->m_size).y < local_90) {
      local_90 = (this->m_size).y - destY;
      local_3c = local_90;
    }
    if ((local_38 != 0) && (local_3c != 0)) {
      iVar5 = (source->m_size).x << 2;
      iVar3 = (this->m_size).x << 2;
      local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&source->m_pixels,0);
      local_60 = local_60 + ((int)local_34 + local_34._4_4_ * (source->m_size).x) * 4;
      local_68 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_pixels,0);
      local_68 = local_68 + (destX + destY * (this->m_size).x) * 4;
      if (applyAlpha) {
        for (local_6c = 0; local_90 = local_6c, local_6c < local_3c; local_6c = local_6c + 1) {
          for (local_70 = 0; local_70 < local_38; local_70 = local_70 + 1) {
            uVar6 = local_70 << 2;
            uVar7 = local_70 << 2;
            bVar1 = local_60[(ulong)uVar6 + 3];
            bVar2 = (bVar1 + local_68[(ulong)uVar7 + 3]) -
                    (char)((ulong)((uint)bVar1 * (uint)local_68[(ulong)uVar7 + 3]) / 0xff);
            local_68[(ulong)uVar7 + 3] = bVar2;
            if (bVar2 == 0) {
              for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
                local_68[(long)local_8c + (ulong)uVar7] = local_60[(long)local_8c + (ulong)uVar6];
              }
            }
            else {
              for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
                local_68[(long)local_88 + (ulong)uVar7] =
                     (value_type)
                     ((int)((uint)local_60[(long)local_88 + (ulong)uVar6] * (uint)bVar1 +
                           (uint)local_68[(long)local_88 + (ulong)uVar7] *
                           ((uint)bVar2 - (uint)bVar1)) / (int)(uint)bVar2);
              }
            }
          }
          local_60 = local_60 + iVar5;
          local_68 = local_68 + iVar3;
        }
      }
      else {
        for (local_90 = 0; local_90 < local_3c; local_90 = local_90 + 1) {
          memcpy(local_68,local_60,(ulong)local_38 << 2);
          local_60 = local_60 + iVar5;
          local_68 = local_68 + iVar3;
        }
      }
    }
  }
  return local_90;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = static_cast<int>(source.m_size.x);
        srcRect.height = static_cast<int>(source.m_size.y);
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = static_cast<int>(source.m_size.x);
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = static_cast<int>(source.m_size.y);
    }

    // Then find the valid bounds of the destination rectangle
    unsigned int width  = static_cast<unsigned int>(srcRect.width);
    unsigned int height = static_cast<unsigned int>(srcRect.height);
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    std::size_t  pitch     = static_cast<std::size_t>(width) * 4;
    unsigned int rows      = height;
    int          srcStride = static_cast<int>(source.m_size.x) * 4;
    int          dstStride = static_cast<int>(m_size.x) * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (static_cast<unsigned int>(srcRect.left) + static_cast<unsigned int>(srcRect.top) * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (unsigned int i = 0; i < rows; ++i)
        {
            for (unsigned int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha values of the destination and source pixels
                Uint8 src_alpha = src[3];
                Uint8 dst_alpha = dst[3];
                Uint8 out_alpha = static_cast<Uint8>(src_alpha + dst_alpha - src_alpha * dst_alpha / 255);

                dst[3] = out_alpha;

                if (out_alpha)
                    for (int k = 0; k < 3; k++)
                        dst[k] = static_cast<Uint8>((src[k] * src_alpha + dst[k] * (out_alpha - src_alpha)) / out_alpha);
                else
                    for (int k = 0; k < 3; k++)
                        dst[k] = src[k];
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (unsigned int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}